

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

uint16_t SharpYuvLinearToGamma(uint32_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  int in_EDX;
  uint16_t in_DI;
  float fVar1;
  float linear;
  float v_float;
  uint16_t local_2;
  
  if (in_EDX == 0xd) {
    local_2 = FromLinearSrgb(0,0x1aa0a4);
  }
  else {
    switch(in_EDX + -1) {
    case 0:
    case 5:
    case 0xd:
    case 0xe:
      FromLinear709(2.445477e-39);
      break;
    default:
      break;
    case 3:
      FromLinear470M(0.0);
      break;
    case 4:
      FromLinear470Bg(0.0);
      break;
    case 6:
      FromLinearSmpte240(2.44557e-39);
      break;
    case 7:
      return in_DI;
    case 8:
      FromLinearLog100(0.0);
      break;
    case 9:
      FromLinearLog100Sqrt10(0.0);
      break;
    case 10:
      FromLinearIec61966(2.445674e-39);
      break;
    case 0xb:
      FromLinearBt1361(2.4457e-39);
      break;
    case 0xf:
      FromLinearPq((float)(in_EDX + -1));
      break;
    case 0x10:
      FromLinearSmpte428(0.0);
      break;
    case 0x11:
      FromLinearHlg(2.44578e-39);
    }
    fVar1 = Roundf(2.445849e-39);
    local_2 = (uint16_t)(int)fVar1;
  }
  return local_2;
}

Assistant:

uint16_t SharpYuvLinearToGamma(uint32_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return FromLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << 16) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = FromLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = FromLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = FromLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = FromLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = FromLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = FromLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = FromLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = FromLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = FromLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = FromLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = FromLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint16_t)Roundf(linear * ((1 << bit_depth) - 1));
}